

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitClass(ParseNodeClass *pnodeClass,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  undefined1 *puVar1;
  ParseNode *this_00;
  Symbol *pSVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot R1;
  RegSlot RVar5;
  RegSlot RVar6;
  RegSlot R0;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeLabel labelID_01;
  uint cacheId;
  RegSlot RVar7;
  undefined4 *puVar8;
  ParseNodeBin *pPVar9;
  ParseNodeFnc *pPVar10;
  FuncInfo *extraout_RDX;
  FuncInfo *extraout_RDX_00;
  FuncInfo *extraout_RDX_01;
  FuncInfo *extraout_RDX_02;
  FuncInfo *pFVar11;
  ParseNodePtr this_01;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  FuncInfo::AcquireLoc(funcInfo,&pnodeClass->super_ParseNode);
  if (pnodeClass->pnodeConstructor == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2a7a,"(pnodeClass->pnodeConstructor)","pnodeClass->pnodeConstructor");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  (pnodeClass->pnodeConstructor->super_ParseNode).location = (pnodeClass->super_ParseNode).location;
  R1 = FuncInfo::AcquireTmpRegister(funcInfo);
  BeginEmitBlock(pnodeClass->pnodeBlock,byteCodeGenerator,funcInfo);
  RVar5 = funcInfo->frameDisplayRegister;
  if (RVar5 == 0xffffffff) {
    RVar5 = FuncInfo::GetEnvRegister(funcInfo);
  }
  RVar6 = FuncInfo::AcquireTmpRegister(funcInfo);
  RVar5 = ByteCodeGenerator::PrependLocalScopes(byteCodeGenerator,RVar5,RVar6,funcInfo);
  if (RVar5 != RVar6) {
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar6);
  }
  if (pnodeClass->pnodeExtends == (ParseNode *)0x0) {
    if ((RVar5 == funcInfo->frameDisplayRegister) ||
       (RVar6 = FuncInfo::GetEnvRegister(funcInfo), RVar5 == RVar6)) {
      Js::ByteCodeWriter::Reg2U
                (&byteCodeGenerator->m_writer,InitBaseClass,(pnodeClass->super_ParseNode).location,
                 R1,pnodeClass->pnodeConstructor->nestedIndex);
    }
    else {
      Js::ByteCodeWriter::Reg3U
                (&byteCodeGenerator->m_writer,InitInnerBaseClass,
                 (pnodeClass->super_ParseNode).location,R1,RVar5,
                 pnodeClass->pnodeConstructor->nestedIndex);
    }
  }
  else {
    Emit(pnodeClass->pnodeExtends,byteCodeGenerator,funcInfo,0,false,false);
    ByteCodeGenerator::StartStatement(byteCodeGenerator,pnodeClass->pnodeExtends);
    bVar4 = FuncInfo::IsTmpReg(funcInfo,pnodeClass->pnodeExtends->location);
    if (bVar4) {
      RVar6 = pnodeClass->pnodeExtends->location;
    }
    else {
      RVar6 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    RVar7 = pnodeClass->pnodeExtends->location;
    if (RVar7 != RVar6) {
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A_ReuseLoc,RVar6,RVar7);
    }
    this = &byteCodeGenerator->m_writer;
    labelID = Js::ByteCodeWriter::DefineLabel(this);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
    labelID_01 = Js::ByteCodeWriter::DefineLabel(this);
    Js::ByteCodeWriter::BrReg1(this,BrOnNotNullObj_A,labelID,RVar6);
    Js::ByteCodeWriter::Reg1(this,LdC_A_Null,R0);
    Js::ByteCodeWriter::Reg1(this,LdBaseFncProto,RVar6);
    Js::ByteCodeWriter::Br(this,labelID_01);
    Js::ByteCodeWriter::MarkLabel(this,labelID);
    Js::ByteCodeWriter::BrReg1(this,BrOnConstructor_A,labelID_00,RVar6);
    Js::ByteCodeWriter::W1(this,RuntimeTypeError,0x140b);
    Js::ByteCodeWriter::MarkLabel(this,labelID_00);
    cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar6,0x124,false,false);
    Js::ByteCodeWriter::PatchableProperty(this,LdFld_ReuseLoc,R0,RVar6,cacheId,false,true);
    Js::ByteCodeWriter::BrReg1(this,BrOnObjectOrNull_A,labelID_01,R0);
    Js::ByteCodeWriter::W1(this,RuntimeTypeError,0x139f);
    Js::ByteCodeWriter::MarkLabel(this,labelID_01);
    if ((RVar5 == funcInfo->frameDisplayRegister) ||
       (RVar7 = FuncInfo::GetEnvRegister(funcInfo), RVar5 == RVar7)) {
      in_stack_ffffffffffffff98 = pnodeClass->pnodeConstructor->nestedIndex;
      Js::ByteCodeWriter::Reg4U
                (this,InitClass,(pnodeClass->super_ParseNode).location,R1,RVar6,R0,
                 in_stack_ffffffffffffff98);
    }
    else {
      in_stack_ffffffffffffff98 = RVar5;
      Js::ByteCodeWriter::Reg5U
                (this,InitInnerClass,(pnodeClass->super_ParseNode).location,R1,RVar6,R0,RVar5,
                 pnodeClass->pnodeConstructor->nestedIndex);
    }
    FuncInfo::ReleaseTmpRegister(funcInfo,R0);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar6);
    Js::ByteCodeWriter::EndStatement(this,pnodeClass->pnodeExtends);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar5);
  this_01 = pnodeClass->pnodeMembers;
  if (this_01 != (ParseNodePtr)0x0) {
    while (this_01->nop == knopList) {
      pPVar9 = ParseNode::AsParseNodeBin(this_01);
      this_00 = pPVar9->pnode1;
      pPVar9 = ParseNode::AsParseNodeBin(this_00);
      pPVar10 = ParseNode::AsParseNodeFnc(pPVar9->pnode2);
      RVar5 = R1;
      if ((pPVar10->fncFlags & kFunctionIsStaticMember) != kFunctionNone) {
        RVar5 = (pnodeClass->super_ParseNode).location;
      }
      EmitMemberNode(this_00,RVar5,byteCodeGenerator,funcInfo,&pnodeClass->super_ParseNode,false,
                     (bool *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      pPVar9 = ParseNode::AsParseNodeBin(this_01);
      this_01 = pPVar9->pnode2;
    }
    pPVar9 = ParseNode::AsParseNodeBin(this_01);
    pPVar10 = ParseNode::AsParseNodeFnc(pPVar9->pnode2);
    RVar5 = R1;
    if ((pPVar10->fncFlags & kFunctionIsStaticMember) != kFunctionNone) {
      RVar5 = (pnodeClass->super_ParseNode).location;
    }
    EmitMemberNode(this_01,RVar5,byteCodeGenerator,funcInfo,&pnodeClass->super_ParseNode,false,
                   (bool *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,R1);
  pFVar11 = extraout_RDX;
  if (pnodeClass->pnodeName != (ParseNodeVar *)0x0) {
    pSVar2 = pnodeClass->pnodeName->sym;
    puVar1 = &pSVar2->field_0x42;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeClass->super_ParseNode).location,pSVar2,(IdentPtr)0x0,
               funcInfo,false,true,false,false);
    pFVar11 = extraout_RDX_00;
  }
  EndEmitBlock(pnodeClass->pnodeBlock,byteCodeGenerator,pFVar11);
  pFVar11 = extraout_RDX_01;
  if (pnodeClass->pnodeDeclName != (ParseNodeVar *)0x0) {
    pSVar2 = pnodeClass->pnodeDeclName->sym;
    puVar1 = &pSVar2->field_0x42;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,(pnodeClass->super_ParseNode).location,pSVar2,(IdentPtr)0x0,
               funcInfo,true,false,false,false);
    pFVar11 = extraout_RDX_02;
  }
  if (pnodeClass->isDefaultModuleExport != true) {
    return;
  }
  ByteCodeGenerator::EmitAssignmentToDefaultModuleExport
            (byteCodeGenerator,&pnodeClass->super_ParseNode,pFVar11);
  return;
}

Assistant:

void EmitClass(ParseNodeClass * pnodeClass, ByteCodeGenerator * byteCodeGenerator, FuncInfo * funcInfo)
{
    funcInfo->AcquireLoc(pnodeClass);

    Assert(pnodeClass->pnodeConstructor);
    pnodeClass->pnodeConstructor->location = pnodeClass->location;
    Js::RegSlot protoLoc = funcInfo->AcquireTmpRegister();
    BeginEmitBlock(pnodeClass->pnodeBlock, byteCodeGenerator, funcInfo);

    Js::RegSlot frameDisplayLoc = funcInfo->frameDisplayRegister != Js::Constants::NoRegister ? funcInfo->frameDisplayRegister : funcInfo->GetEnvRegister();
    Js::RegSlot tmpFrameDisplayLoc = funcInfo->AcquireTmpRegister();
    frameDisplayLoc = byteCodeGenerator->PrependLocalScopes(frameDisplayLoc, tmpFrameDisplayLoc, funcInfo);
    if (frameDisplayLoc != tmpFrameDisplayLoc)
    {
        funcInfo->ReleaseTmpRegister(tmpFrameDisplayLoc);
    }

    // Extends
    if (pnodeClass->pnodeExtends)
    {
        Emit(pnodeClass->pnodeExtends, byteCodeGenerator, funcInfo, false);

        byteCodeGenerator->StartStatement(pnodeClass->pnodeExtends);

        Js::RegSlot ctorParentLoc = funcInfo->IsTmpReg(pnodeClass->pnodeExtends->location) ? pnodeClass->pnodeExtends->location : funcInfo->AcquireTmpRegister();
        Js::RegSlot protoParentLoc = funcInfo->AcquireTmpRegister();

        if (pnodeClass->pnodeExtends->location != ctorParentLoc)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, ctorParentLoc, pnodeClass->pnodeExtends->location);
        }

        Js::ByteCodeLabel needProto = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel haveConstructor = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel labelParentsFound = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnNotNullObj_A, needProto, ctorParentLoc);

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdC_A_Null, protoParentLoc);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdBaseFncProto, ctorParentLoc);
        byteCodeGenerator->Writer()->Br(labelParentsFound);

        byteCodeGenerator->Writer()->MarkLabel(needProto);
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnConstructor_A, haveConstructor, ctorParentLoc);
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ErrorOnNew));

        byteCodeGenerator->Writer()->MarkLabel(haveConstructor);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(ctorParentLoc, Js::PropertyIds::prototype, false, false);
        byteCodeGenerator->Writer()->PatchableProperty(Js::OpCode::LdFld_ReuseLoc, protoParentLoc, ctorParentLoc, cacheId);
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnObjectOrNull_A, labelParentsFound, protoParentLoc);
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_InvalidPrototype));

        byteCodeGenerator->Writer()->MarkLabel(labelParentsFound);
        if (frameDisplayLoc == funcInfo->frameDisplayRegister || frameDisplayLoc  == funcInfo->GetEnvRegister())
        {
            byteCodeGenerator->Writer()->Reg4U(Js::OpCode::InitClass, pnodeClass->location, protoLoc, ctorParentLoc, protoParentLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->Reg5U(Js::OpCode::InitInnerClass, pnodeClass->location, protoLoc, ctorParentLoc, protoParentLoc, frameDisplayLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }

        funcInfo->ReleaseTmpRegister(protoParentLoc);
        funcInfo->ReleaseTmpRegister(ctorParentLoc);

        byteCodeGenerator->EndStatement(pnodeClass->pnodeExtends);
    }
    else
    {
        if (frameDisplayLoc == funcInfo->frameDisplayRegister || frameDisplayLoc  == funcInfo->GetEnvRegister())
        {
            byteCodeGenerator->Writer()->Reg2U(Js::OpCode::InitBaseClass, pnodeClass->location, protoLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->Reg3U(Js::OpCode::InitInnerBaseClass, pnodeClass->location, protoLoc, frameDisplayLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
    }

    funcInfo->ReleaseTmpRegister(frameDisplayLoc);

    // Methods
    bool isObjectEmpty = true;
    ParseNode * pnodeMembers = pnodeClass->pnodeMembers;
    ParseNode * pnodeMember;
    ParseNodeFnc * pnodeMemberFnc;
    if (pnodeMembers != nullptr)
    {
        while (pnodeMembers->nop == knopList)
        {
            pnodeMember = pnodeMembers->AsParseNodeBin()->pnode1;
            pnodeMemberFnc = pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc();
            EmitMemberNode(pnodeMember, pnodeMemberFnc->IsStaticMember() ? pnodeClass->location : protoLoc, byteCodeGenerator, funcInfo, pnodeClass, /*useStore*/ false, &isObjectEmpty);
            pnodeMembers = pnodeMembers->AsParseNodeBin()->pnode2;
        }
        pnodeMemberFnc = pnodeMembers->AsParseNodeBin()->pnode2->AsParseNodeFnc();
        EmitMemberNode(pnodeMembers, pnodeMemberFnc->IsStaticMember() ? pnodeClass->location : protoLoc, byteCodeGenerator, funcInfo, pnodeClass, /*useStore*/ false, &isObjectEmpty);
    }

    funcInfo->ReleaseTmpRegister(protoLoc);

    // Emit name binding.
    if (pnodeClass->pnodeName)
    {
        Symbol * sym = pnodeClass->pnodeName->sym;
        sym->SetNeedDeclaration(false);
        byteCodeGenerator->EmitPropStore(pnodeClass->location, sym, nullptr, funcInfo, false, true);
    }

    EndEmitBlock(pnodeClass->pnodeBlock, byteCodeGenerator, funcInfo);

    if (pnodeClass->pnodeDeclName)
    {
        Symbol * sym = pnodeClass->pnodeDeclName->sym;
        sym->SetNeedDeclaration(false);
        byteCodeGenerator->EmitPropStore(pnodeClass->location, sym, nullptr, funcInfo, true, false);
    }

    if (pnodeClass->IsDefaultModuleExport())
    {
        byteCodeGenerator->EmitAssignmentToDefaultModuleExport(pnodeClass, funcInfo);
    }
}